

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings_tests.cpp
# Opt level: O0

void blockencodings_tests::SimpleRoundTripTest_invoker(void)

{
  basic_wrap_stringstream<char> *line_num;
  basic_wrap_stringstream<char> *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long in_FS_OFFSET;
  SimpleRoundTripTest t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff178;
  std_string *in_stack_fffffffffffff180;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff188;
  const_string *in_stack_fffffffffffff1a0;
  size_t in_stack_fffffffffffff1a8;
  const_string *in_stack_fffffffffffff1b0;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffff1b8;
  unit_test_log_t *this_00;
  const_string local_c88 [25];
  undefined1 local_af0 [408];
  undefined1 local_958 [408];
  undefined1 local_7c0 [408];
  SimpleRoundTripTest local_628;
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [20])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [15])in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
             in_stack_fffffffffffff1a0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  SimpleRoundTripTest::SimpleRoundTripTest((SimpleRoundTripTest *)in_stack_fffffffffffff178);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  memset(local_7c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [20])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [16])in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
             in_stack_fffffffffffff1a0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::unit_test::setup_conditional<blockencodings_tests::SimpleRoundTripTest>
            ((SimpleRoundTripTest *)0x42cebe);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  memset(local_958,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [20])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [13])in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
             in_stack_fffffffffffff1a0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  SimpleRoundTripTest::test_method(&local_628);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  memset(local_af0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [20])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [19])in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
             in_stack_fffffffffffff1a0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::unit_test::teardown_conditional<blockencodings_tests::SimpleRoundTripTest>
            ((SimpleRoundTripTest *)0x42d10e);
  this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  file = local_c88;
  memset(file,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  line_num = boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  msg = boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [20])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [15])in_stack_fffffffffffff180);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (this_00,file,(size_t)line_num,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  SimpleRoundTripTest::~SimpleRoundTripTest((SimpleRoundTripTest *)in_stack_fffffffffffff178);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(SimpleRoundTripTest)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    TestMemPoolEntryHelper entry;
    auto rand_ctx(FastRandomContext(uint256{42}));
    CBlock block(BuildBlockTestCase(rand_ctx));

    LOCK2(cs_main, pool.cs);
    pool.addUnchecked(entry.FromTx(block.vtx[2]));
    BOOST_CHECK_EQUAL(pool.get(block.vtx[2]->GetHash()).use_count(), SHARED_TX_OFFSET + 0);

    // Do a simple ShortTxIDs RT
    {
        CBlockHeaderAndShortTxIDs shortIDs{block, rand_ctx.rand64()};

        DataStream stream{};
        stream << shortIDs;

        CBlockHeaderAndShortTxIDs shortIDs2;
        stream >> shortIDs2;

        PartiallyDownloadedBlock partialBlock(&pool);
        BOOST_CHECK(partialBlock.InitData(shortIDs2, empty_extra_txn) == READ_STATUS_OK);
        BOOST_CHECK( partialBlock.IsTxAvailable(0));
        BOOST_CHECK(!partialBlock.IsTxAvailable(1));
        BOOST_CHECK( partialBlock.IsTxAvailable(2));

        BOOST_CHECK_EQUAL(pool.get(block.vtx[2]->GetHash()).use_count(), SHARED_TX_OFFSET + 1);

        size_t poolSize = pool.size();
        pool.removeRecursive(*block.vtx[2], MemPoolRemovalReason::REPLACED);
        BOOST_CHECK_EQUAL(pool.size(), poolSize - 1);

        CBlock block2;
        {
            PartiallyDownloadedBlock tmp = partialBlock;
            BOOST_CHECK(partialBlock.FillBlock(block2, {}) == READ_STATUS_INVALID); // No transactions
            partialBlock = tmp;
        }

        // Wrong transaction
        {
            PartiallyDownloadedBlock tmp = partialBlock;
            partialBlock.FillBlock(block2, {block.vtx[2]}); // Current implementation doesn't check txn here, but don't require that
            partialBlock = tmp;
        }
        bool mutated;
        BOOST_CHECK(block.hashMerkleRoot != BlockMerkleRoot(block2, &mutated));

        CBlock block3;
        BOOST_CHECK(partialBlock.FillBlock(block3, {block.vtx[1]}) == READ_STATUS_OK);
        BOOST_CHECK_EQUAL(block.GetHash().ToString(), block3.GetHash().ToString());
        BOOST_CHECK_EQUAL(block.hashMerkleRoot.ToString(), BlockMerkleRoot(block3, &mutated).ToString());
        BOOST_CHECK(!mutated);
    }
}